

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pal_packing.cpp
# Opt level: O0

void packing::decant(vector<packing::AssignedProtos,_std::allocator<packing::AssignedProtos>_>
                     *assignments,vector<ProtoPalette,_std::allocator<ProtoPalette>_> *protoPalettes
                    )

{
  size_type sVar1;
  anon_class_8_1_81365d80 local_38;
  anon_class_8_1_81365d80 local_30;
  anon_class_8_1_81365d80 local_28;
  vector<packing::AssignedProtos,_std::allocator<packing::AssignedProtos>_> *local_20;
  anon_class_8_1_79d63da6 decantOn;
  vector<ProtoPalette,_std::allocator<ProtoPalette>_> *protoPalettes_local;
  vector<packing::AssignedProtos,_std::allocator<packing::AssignedProtos>_> *assignments_local;
  
  local_20 = assignments;
  decantOn.assignments =
       (vector<packing::AssignedProtos,_std::allocator<packing::AssignedProtos>_> *)protoPalettes;
  sVar1 = std::vector<packing::AssignedProtos,_std::allocator<packing::AssignedProtos>_>::size
                    (assignments);
  Options::verbosePrint(&options,'\x04',"%zu palettes before decanting\n",sVar1);
  local_28.protoPalettes =
       (vector<ProtoPalette,_std::allocator<ProtoPalette>_> *)decantOn.assignments;
  decant(std::vector<packing::AssignedProtos,std::allocator<packing::AssignedProtos>>&,std::vector<ProtoPalette,std::allocator<ProtoPalette>>const&)
  ::$_0::operator()((__0 *)&local_20,&local_28);
  sVar1 = std::vector<packing::AssignedProtos,_std::allocator<packing::AssignedProtos>_>::size
                    (assignments);
  Options::verbosePrint(&options,'\x04',"%zu palettes after decanting on palettes\n",sVar1);
  local_30.protoPalettes =
       (vector<ProtoPalette,_std::allocator<ProtoPalette>_> *)decantOn.assignments;
  decant(std::vector<packing::AssignedProtos,std::allocator<packing::AssignedProtos>>&,std::vector<ProtoPalette,std::allocator<ProtoPalette>>const&)
  ::$_0::operator()((__0 *)&local_20,&local_30);
  sVar1 = std::vector<packing::AssignedProtos,_std::allocator<packing::AssignedProtos>_>::size
                    (assignments);
  Options::verbosePrint(&options,'\x04',"%zu palettes after decanting on \"components\"\n",sVar1);
  local_38.protoPalettes =
       (vector<ProtoPalette,_std::allocator<ProtoPalette>_> *)decantOn.assignments;
  decant(std::vector<packing::AssignedProtos,std::allocator<packing::AssignedProtos>>&,std::vector<ProtoPalette,std::allocator<ProtoPalette>>const&)
  ::$_0::operator()((__0 *)&local_20,&local_38);
  sVar1 = std::vector<packing::AssignedProtos,_std::allocator<packing::AssignedProtos>_>::size
                    (assignments);
  Options::verbosePrint(&options,'\x04',"%zu palettes after decanting on proto-palettes\n",sVar1);
  return;
}

Assistant:

static void decant(std::vector<AssignedProtos> &assignments,
                   std::vector<ProtoPalette> const &protoPalettes) {
	// "Decanting" is the process of moving all *things* that can fit in a lower index there
	auto decantOn = [&assignments](auto const &tryDecanting) {
		// No need to attempt decanting on palette #0, as there are no palettes to decant to
		for (size_t from = assignments.size(); --from;) {
			// Scan all palettes before this one
			for (size_t to = 0; to < from; ++to) {
				tryDecanting(assignments[to], assignments[from]);
			}

			// If the proto-palette is now empty, remove it
			// Doing this now reduces the number of iterations performed by later steps
			// NB: order is intentionally preserved so as not to alter the "decantation"'s
			// properties
			// NB: this does mean that the first step might get empty palettes as its input!
			// NB: this is safe to do because we go towards the beginning of the vector, thereby not
			// invalidating our iteration (thus, iterators should not be used to drivethe outer
			// loop)
			if (assignments[from].empty()) {
				assignments.erase(assignments.begin() + from);
			}
		}
	};

	options.verbosePrint(Options::VERB_DEBUG, "%zu palettes before decanting\n",
	                     assignments.size());

	// Decant on palettes
	decantOn([&protoPalettes](AssignedProtos &to, AssignedProtos &from) {
		// If the entire palettes can be merged, move all of `from`'s proto-palettes
		if (to.combinedVolume(from.begin(), from.end(), protoPalettes)
		    <= options.maxOpaqueColors()) {
			for (ProtoPalAttrs &attrs : from) {
				to.assign(attrs.protoPalIndex);
			}
			from.clear();
		}
	});
	options.verbosePrint(Options::VERB_DEBUG, "%zu palettes after decanting on palettes\n",
	                     assignments.size());

	// Decant on "components" (= proto-pals sharing colors)
	decantOn([&protoPalettes](AssignedProtos &to, AssignedProtos &from) {
		// We need to iterate on all the "components", which are groups of proto-palettes sharing at
		// least one color with another proto-palettes in the group.
		// We do this by adding the first available proto-palette, and then looking for palettes
		// with common colors. (As an optimization, we know we can skip palettes already scanned.)
		std::vector<bool> processed(from.nbProtoPals(), false);
		std::unordered_set<uint16_t> colors;
		std::vector<size_t> members;
		while (true) {
			auto iter = std::find(processed.begin(), processed.end(), true);
			if (iter == processed.end()) { // Processed everything!
				break;
			}
			auto attrs = from.begin();
			std::advance(attrs, (iter - processed.begin()));

			// Build up the "component"...
			colors.clear();
			members.clear();
			assert(members.empty()); // Compiler optimization hint
			do {
				ProtoPalette const &protoPal = protoPalettes[attrs->protoPalIndex];
				// If this is the first proto-pal, or if at least one color matches, add it
				if (members.empty()
				    || std::find_first_of(colors.begin(), colors.end(), protoPal.begin(),
				                          protoPal.end())
				           != colors.end()) {
					colors.insert(protoPal.begin(), protoPal.end());
					members.push_back(iter - processed.begin());
					*iter = true; // Mark that proto-pal as processed
				}
				++iter;
				++attrs;
			} while (iter != processed.end());

			if (to.combinedVolume(colors.begin(), colors.end()) <= options.maxOpaqueColors()) {
				// Iterate through the component's proto-palettes, and transfer them
				auto member = from.begin();
				size_t curIndex = 0;
				for (size_t index : members) {
					std::advance(member, index - curIndex);
					curIndex = index;
					to.assign(std::move(*member));
					from.remove(member); // Removing does not shift elements, so it's cheap
				}
			}
		}
	});
	options.verbosePrint(Options::VERB_DEBUG, "%zu palettes after decanting on \"components\"\n",
	                     assignments.size());

	// Decant on individual proto-palettes
	decantOn([&protoPalettes](AssignedProtos &to, AssignedProtos &from) {
		for (auto iter = from.begin(); iter != from.end(); ++iter) {
			if (to.canFit(protoPalettes[iter->protoPalIndex])) {
				to.assign(std::move(*iter));
				from.remove(iter);
			}
		}
	});
	options.verbosePrint(Options::VERB_DEBUG, "%zu palettes after decanting on proto-palettes\n",
	                     assignments.size());
}